

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

string * __thiscall
tcu::Format::Hex<2ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  allocator<char> local_59;
  char local_58 [8];
  char buf [19];
  char local_38 [8];
  char shortFmt [9];
  char longFmt [10];
  Hex<2UL> *this_local;
  
  stack0xffffffffffffffd8 = 0x6c6c323030257830;
  builtin_strncpy(local_38,"0x%02llx",8);
  shortFmt[0] = '\0';
  deSprintf(local_58,0x13,local_38,*this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_58,&local_59);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		DE_STATIC_ASSERT(0 < NumDigits && NumDigits <= 16);

		const char longFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits/10, '0' + NumDigits%10, 'l', 'l', 'x', 0};
		const char shortFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits, 'l', 'l', 'x', 0};

		char buf[sizeof(deUint64)*2 + 3];
		deSprintf(buf, sizeof(buf), NumDigits > 9 ? longFmt : shortFmt, value);

		return std::string(buf);
	}